

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O2

Int __thiscall ipx::Maxvolume::RunSequential(Maxvolume *this,double *colscale,Basis *basis)

{
  uint uVar1;
  int j;
  pointer piVar2;
  bool bVar3;
  BasicStatus BVar4;
  Int IVar5;
  Model *pMVar6;
  ulong uVar7;
  Int ii;
  ulong uVar8;
  double dVar9;
  double dVar10;
  bool exchanged;
  uint local_f8;
  ipxint local_f4;
  Int pmax;
  Int local_ec;
  double vmax;
  double dj;
  Basis *local_d8;
  Maxvolume *local_d0;
  double *local_c8;
  Vector invscale_basic;
  vector<int,_std::allocator<int>_> candidates;
  Timer timer;
  IndexedVector ftran;
  anon_class_40_5_d735ebaa search_pivot;
  
  pMVar6 = Basis::model(basis);
  uVar1 = pMVar6->num_rows_;
  local_ec = pMVar6->num_cols_;
  IndexedVector::IndexedVector(&ftran,uVar1);
  Timer::Timer(&timer);
  local_f4 = (this->control_->parameters_).super_ipx_parameters.maxpasses;
  dVar10 = (this->control_->parameters_).super_ipx_parameters.volume_tol;
  dVar9 = 1.0;
  if (1.0 <= dVar10) {
    dVar9 = dVar10;
  }
  std::valarray<double>::valarray(&invscale_basic,(long)(int)uVar1);
  uVar8 = 0;
  uVar7 = 0;
  local_f8 = uVar1;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    IVar5 = (basis->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8];
    BVar4 = Basis::StatusOf(basis,IVar5);
    if (BVar4 == BASIC) {
      dVar10 = 1.0;
      if (colscale != (double *)0x0) {
        dVar10 = 1.0 / colscale[IVar5];
      }
      invscale_basic._M_data[uVar8] = dVar10;
    }
  }
  local_c8 = &this->tblmax_;
  this->tblnnz_ = 0;
  this->volinc_ = 0.0;
  this->time_ = 0.0;
  this->updates_ = 0;
  this->skipped_ = 0;
  this->passes_ = 0;
  this->slices_ = 0;
  this->tblmax_ = 0.0;
  this->frobnorm_squared_ = 0.0;
  local_ec = local_ec + local_f8;
  local_d8 = basis;
  local_d0 = this;
  while ((local_f4 < 0 || (this->passes_ < local_f4))) {
    this->tblnnz_ = 0;
    *local_c8 = 0.0;
    local_c8[1] = 0.0;
    Sortperm(&candidates,local_ec,colscale,false);
    local_f8 = 0;
LAB_003849fa:
    for (; candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start !=
           candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
        candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1) {
      j = candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish[-1];
      if (colscale == (double *)0x0) {
        dj = 1.0;
      }
      else {
        dj = colscale[j];
        if ((dj == 0.0) && (!NAN(dj))) break;
      }
      BVar4 = Basis::StatusOf(basis,j);
      if (BVar4 != NONBASIC) goto LAB_00384a4e;
      IVar5 = Control::InterruptCheck(this->control_,-1);
      if (IVar5 != 0) goto LAB_00384c09;
      Basis::SolveForUpdate(basis,j,&ftran);
      pmax = -1;
      vmax = 0.0;
      search_pivot.invscale_basic = &invscale_basic;
      search_pivot.dj = &dj;
      search_pivot.vmax = &vmax;
      search_pivot.pmax = &pmax;
      search_pivot.this = this;
      bVar3 = IndexedVector::sparse(&ftran);
      piVar2 = ftran.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar3) {
        uVar1 = ftran.nnz_;
        if (ftran.nnz_ < 1) {
          uVar1 = 0;
        }
        for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
          RunSequential::anon_class_40_5_d735ebaa::operator()
                    (&search_pivot,piVar2[uVar7],ftran.elements_._M_data[piVar2[uVar7]]);
        }
      }
      else {
        uVar1 = (uint)ftran.elements_._M_size;
        if ((int)(uint)ftran.elements_._M_size < 1) {
          uVar1 = 0;
        }
        for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
          RunSequential::anon_class_40_5_d735ebaa::operator()
                    (&search_pivot,(Int)uVar7,ftran.elements_._M_data[uVar7]);
        }
      }
      basis = local_d8;
      dVar10 = vmax;
      if (vmax <= *local_c8) {
        dVar10 = *local_c8;
      }
      *local_c8 = dVar10;
      if (dVar9 < vmax) {
        IVar5 = Basis::ExchangeIfStable
                          (local_d8,(local_d8->basis_).super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl.super__Vector_impl_data._M_start[pmax],j,
                           ftran.elements_._M_data[pmax],-1,&exchanged);
        this = local_d0;
        if (IVar5 == 0) goto code_r0x00384bc0;
        goto LAB_00384c09;
      }
      local_d0->skipped_ = local_d0->skipped_ + 1;
      this = local_d0;
    }
    IVar5 = 0;
LAB_00384c09:
    uVar1 = local_f8;
    this->updates_ = this->updates_ + local_f8;
    this->passes_ = this->passes_ + 1;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&candidates.super__Vector_base<int,_std::allocator<int>_>);
    if ((uVar1 == 0) || (IVar5 != 0)) goto LAB_00384c33;
  }
  IVar5 = 0;
LAB_00384c33:
  dVar10 = Timer::Elapsed(&timer);
  this->time_ = dVar10;
  operator_delete(invscale_basic._M_data);
  IndexedVector::~IndexedVector(&ftran);
  return IVar5;
code_r0x00384bc0:
  if (exchanged == true) {
    invscale_basic._M_data[pmax] = 1.0 / dj;
    local_f8 = local_f8 + 1;
    dVar10 = log2(vmax);
    this->volinc_ = dVar10 + this->volinc_;
LAB_00384a4e:
    candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
  }
  goto LAB_003849fa;
}

Assistant:

Int Maxvolume::RunSequential(const double* colscale, Basis& basis) {
    const Model& model = basis.model();
    const Int m = model.rows();
    const Int n = model.cols();
    IndexedVector ftran(m);
    Timer timer;
    Int errflag = 0;

    const Int maxpasses = control_.maxpasses();
    const double volumetol = std::max(control_.volume_tol(), 1.0);

    // Maintain a copy of the inverse scaling factors of basic variables.
    // If a variable has status BASIC_FREE, its inverse scaling factor is
    // assumed zero, regardless of the entry in colscale. This ensures that
    // BASIC_FREE variables are never pivoted out of the basis.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis[p];
        if (basis.StatusOf(j) == Basis::BASIC)
            invscale_basic[p] = colscale ? 1.0/colscale[j] : 1.0;
    }

    Reset();
    while (passes_ < maxpasses || maxpasses < 0) {
        tblnnz_ = 0;
        tblmax_ = 0.0;
        frobnorm_squared_ = 0.0;
        Int updates_last = 0;   // # basis updates in this pass
        std::vector<Int> candidates = Sortperm(n+m, colscale, false);
        while(!candidates.empty()) {
            Int j = candidates.back();
            const double dj = colscale ? colscale[j] : 1.0;
            if (dj == 0.0)      // all remaining columns have scaling factor 0
                break;
            if (basis.StatusOf(j) != Basis::NONBASIC) {
                candidates.pop_back();
                continue;
            }
            if ((errflag = control_.InterruptCheck()) != 0)
                break;
            basis.SolveForUpdate(j, ftran);
            Int pmax = -1;
            double vmax = 0.0;
            auto search_pivot = [&](Int p, double x) {
                double v = std::abs(x) * invscale_basic[p] * dj;
                if (v > vmax) {
                    vmax = v;
                    pmax = p;
                }
                tblnnz_ += v != 0;
                frobnorm_squared_ += v*v;
            };
            for_each_nonzero(ftran, search_pivot);
            tblmax_ = std::max(tblmax_, vmax);
            if (vmax <= volumetol) {
                skipped_++;
                candidates.pop_back();
                continue;
            }

            const Int jb = basis[pmax];
            assert(basis.StatusOf(jb) == Basis::BASIC);
            bool exchanged;
            errflag = basis.ExchangeIfStable(jb, j, ftran[pmax], -1, &exchanged);
            if (errflag)
                break;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[pmax] = 1.0 / dj;
            updates_last++;
            volinc_ += std::log2(vmax);
            candidates.pop_back();
        }
        updates_ += updates_last;
        passes_++;
        if (updates_last == 0 || errflag != 0)
            break;
    }
    time_ = timer.Elapsed();
    return errflag;
}